

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

void __thiscall luna::GC::GC(GC *this,GCObjectDeleter *obj_deleter,bool log)

{
  memset(this,0,0xc0);
  std::_Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::_M_initialize_map
            (&(this->barriered_).
              super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>,0);
  std::function<void_(luna::GCObject_*,_unsigned_int)>::function(&this->obj_deleter_,obj_deleter);
  std::ofstream::ofstream(&this->log_stream_);
  (this->gen0_).threshold_count_ = 0x200;
  (this->gen1_).threshold_count_ = 0x200;
  if (log) {
    std::ofstream::open((char *)&this->log_stream_,0x13fc7a);
  }
  return;
}

Assistant:

GC::GC(const GCObjectDeleter &obj_deleter, bool log)
        : obj_deleter_(obj_deleter)
    {
        gen0_.threshold_count_ = kGen0InitThresholdCount;
        gen1_.threshold_count_ = kGen1InitThresholdCount;

        if (log)
        {
            log_stream_.open("gc.log");
        }
    }